

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool google::protobuf::anon_unknown_1::RetrieveOptions
               (int depth,Message *options,DescriptorPool *pool,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *option_entries)

{
  bool bVar1;
  int iVar2;
  Descriptor *pDVar3;
  FileDescriptor *this;
  DescriptorPool *pDVar4;
  string *psVar5;
  Message *pMVar6;
  undefined4 extraout_var;
  MessageLite *this_00;
  LogMessage *pLVar7;
  LogFinisher local_d1;
  LogMessage local_d0;
  undefined4 local_94;
  string local_90;
  scoped_ptr<google::protobuf::Message> local_60;
  scoped_ptr<google::protobuf::Message> dynamic_options;
  DynamicMessageFactory factory;
  Descriptor *option_descriptor;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *option_entries_local;
  DescriptorPool *pool_local;
  Message *options_local;
  int depth_local;
  
  pDVar3 = Message::GetDescriptor(options);
  this = Descriptor::file(pDVar3);
  pDVar4 = FileDescriptor::pool(this);
  if (pDVar4 == pool) {
    options_local._7_1_ = RetrieveOptionsAssumingRightPool(depth,options,option_entries);
  }
  else {
    pDVar3 = Message::GetDescriptor(options);
    psVar5 = Descriptor::full_name_abi_cxx11_(pDVar3);
    pDVar3 = DescriptorPool::FindMessageTypeByName(pool,psVar5);
    if (pDVar3 == (Descriptor *)0x0) {
      options_local._7_1_ = RetrieveOptionsAssumingRightPool(depth,options,option_entries);
    }
    else {
      DynamicMessageFactory::DynamicMessageFactory((DynamicMessageFactory *)&dynamic_options);
      pMVar6 = DynamicMessageFactory::GetPrototype((DynamicMessageFactory *)&dynamic_options,pDVar3)
      ;
      iVar2 = (*(pMVar6->super_MessageLite)._vptr_MessageLite[3])();
      internal::scoped_ptr<google::protobuf::Message>::scoped_ptr
                (&local_60,(Message *)CONCAT44(extraout_var,iVar2));
      this_00 = &internal::scoped_ptr<google::protobuf::Message>::operator->(&local_60)->
                 super_MessageLite;
      MessageLite::SerializeAsString_abi_cxx11_(&local_90,&options->super_MessageLite);
      bVar1 = MessageLite::ParseFromString(this_00,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      if (bVar1) {
        pMVar6 = internal::scoped_ptr<google::protobuf::Message>::operator*(&local_60);
        options_local._7_1_ = RetrieveOptionsAssumingRightPool(depth,pMVar6,option_entries);
      }
      else {
        internal::LogMessage::LogMessage
                  (&local_d0,LOGLEVEL_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                   ,0x888);
        pLVar7 = internal::LogMessage::operator<<(&local_d0,"Found invalid proto option data for: ")
        ;
        pDVar3 = Message::GetDescriptor(options);
        psVar5 = Descriptor::full_name_abi_cxx11_(pDVar3);
        pLVar7 = internal::LogMessage::operator<<(pLVar7,psVar5);
        internal::LogFinisher::operator=(&local_d1,pLVar7);
        internal::LogMessage::~LogMessage(&local_d0);
        options_local._7_1_ = RetrieveOptionsAssumingRightPool(depth,options,option_entries);
      }
      local_94 = 1;
      internal::scoped_ptr<google::protobuf::Message>::~scoped_ptr(&local_60);
      DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)&dynamic_options);
    }
  }
  return options_local._7_1_;
}

Assistant:

bool RetrieveOptions(int depth, const Message& options,
                     const DescriptorPool* pool,
                     std::vector<string>* option_entries) {
  // When printing custom options for a descriptor, we must use an options
  // message built on top of the same DescriptorPool where the descriptor
  // is coming from. This is to ensure we are interpreting custom options
  // against the right pool.
  if (options.GetDescriptor()->file()->pool() == pool) {
    return RetrieveOptionsAssumingRightPool(depth, options, option_entries);
  } else {
    const Descriptor* option_descriptor =
        pool->FindMessageTypeByName(options.GetDescriptor()->full_name());
    if (option_descriptor == NULL) {
      // google/protobuf/descriptor.proto is not in the pool. This means no
      // custom options are used so we are safe to proceed with the compiled
      // options message type.
      return RetrieveOptionsAssumingRightPool(depth, options, option_entries);
    }
    DynamicMessageFactory factory;
    google::protobuf::scoped_ptr<Message> dynamic_options(
        factory.GetPrototype(option_descriptor)->New());
    if (dynamic_options->ParseFromString(options.SerializeAsString())) {
      return RetrieveOptionsAssumingRightPool(depth, *dynamic_options,
                                              option_entries);
    } else {
      GOOGLE_LOG(ERROR) << "Found invalid proto option data for: "
                 << options.GetDescriptor()->full_name();
      return RetrieveOptionsAssumingRightPool(depth, options, option_entries);
    }
  }
}